

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<signed_char,std::char_traits<signed_char>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,signed_char>
          (pair<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
          begin,__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                end,char in_delim)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  in_itr;
  basic_string_view<signed_char,_std::char_traits<signed_char>_> bVar3;
  size_t local_a0;
  char *local_98;
  size_t local_80;
  char *local_78;
  size_t local_60;
  char *local_58;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  local_50;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  itr;
  undefined1 local_40 [8];
  pair<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>
  result;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  _Stack_18;
  char in_delim_local;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  end_local;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  begin_local;
  
  result.second._M_str._7_1_ = (char)end._M_current;
  _Stack_18._M_current = begin._M_current;
  end_local._M_current = (char *)this;
  std::
  pair<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>
  ::
  pair<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_true>
            ((pair<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,_std::basic_string_view<signed_char,_std::char_traits<signed_char>_>_>
              *)local_40);
  itr._M_current._7_1_ =
       __gnu_cxx::
       operator<=><signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>
                 (&end_local,&stack0xffffffffffffffe8);
  std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&itr._M_current + 6),(__unspec *)0x0);
  bVar1 = std::operator>=(itr._M_current._7_1_);
  if (bVar1) {
    (__return_storage_ptr__->first)._M_len = (size_t)local_40;
    (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
  }
  else {
    local_50._M_current = end_local._M_current;
    while (bVar1 = __gnu_cxx::
                   operator==<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                             (&local_50,&stack0xffffffffffffffe8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
               ::operator*(&local_50);
      if (*pcVar2 == result.second._M_str._7_1_) {
        bVar3 = make_split_member<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,_nullptr>
                          (end_local,local_50);
        local_60 = bVar3._M_len;
        local_40 = (undefined1  [8])local_60;
        local_58 = bVar3._M_str;
        result.first._M_len = (size_t)local_58;
        in_itr = __gnu_cxx::
                 __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                 ::operator+(&local_50,1);
        bVar3 = make_split_member<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,_nullptr>
                          (in_itr,_Stack_18);
        local_80 = bVar3._M_len;
        local_78 = bVar3._M_str;
        (__return_storage_ptr__->first)._M_len = (size_t)local_40;
        (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
        (__return_storage_ptr__->second)._M_len = local_80;
        (__return_storage_ptr__->second)._M_str = local_78;
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
      ::operator++(&local_50);
    }
    bVar3 = make_split_member<std::basic_string_view<signed_char,_std::char_traits<signed_char>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,___gnu_cxx::__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>,_nullptr>
                      (end_local,_Stack_18);
    local_a0 = bVar3._M_len;
    local_98 = bVar3._M_str;
    (__return_storage_ptr__->first)._M_len = local_a0;
    (__return_storage_ptr__->first)._M_str = local_98;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}